

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

string * __thiscall
cs_impl::any::
holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
::to_string_abi_cxx11_
          (string *__return_storage_ptr__,
          holder<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
          *this)

{
  long lVar1;
  long lVar2;
  string str;
  const_iterator __begin1;
  _Alloc_hider local_a8;
  size_type local_a0;
  char local_98;
  undefined7 uStack_97;
  undefined8 uStack_90;
  string *local_88;
  iterator local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (*(long *)(this + 0x18) == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"cs::hash_set => {}",(allocator *)&local_a8);
  }
  else {
    local_88 = __return_storage_ptr__;
    std::__cxx11::string::string((string *)&local_a8,"cs::hash_set => {",(allocator *)&local_70);
    local_80 = phmap::priv::
               raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               ::begin((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                        *)(this + 8));
    lVar1 = *(long *)(this + 8);
    lVar2 = *(long *)(this + 0x20);
    while (local_80.ctrl_ != (ctrl_t *)(lVar1 + lVar2)) {
      any::to_string_abi_cxx11_(&local_50,local_80.field_1.slot_);
      std::operator+(&local_70,&local_50,", ");
      std::__cxx11::string::append((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::iterator::operator++(&local_80);
    }
    std::__cxx11::string::resize((ulong)&local_a8);
    std::__cxx11::string::append((char *)&local_a8);
    __return_storage_ptr__ = local_88;
    (local_88->_M_dataplus)._M_p = (pointer)&local_88->field_2;
    if (local_a8._M_p == &local_98) {
      (local_88->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
      *(undefined8 *)((long)&local_88->field_2 + 8) = uStack_90;
    }
    else {
      (local_88->_M_dataplus)._M_p = local_a8._M_p;
      (local_88->field_2)._M_allocated_capacity = CONCAT71(uStack_97,local_98);
    }
    local_88->_M_string_length = local_a0;
    local_a0 = 0;
    local_98 = '\0';
    local_a8._M_p = &local_98;
    std::__cxx11::string::~string((string *)&local_a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string() const override
			{
				return cs_impl::to_string(mDat);
			}